

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::resetIndex(QGraphicsSceneBspTreeIndexPrivate *this)

{
  parameter_type t;
  int i;
  ulong uVar1;
  
  purgeRemovedItems(this);
  for (uVar1 = 0; uVar1 < (ulong)(this->indexedItems).d.size; uVar1 = uVar1 + 1) {
    t = (this->indexedItems).d.ptr[uVar1];
    if (t != (parameter_type)0x0) {
      ((t->d_ptr).d)->index = -1;
      QList<QGraphicsItem_*>::append(&this->unindexedItems,t);
    }
  }
  QList<QGraphicsItem_*>::clear(&this->indexedItems);
  QList<int>::clear(&this->freeItemIndexes);
  QList<QGraphicsItem_*>::clear(&this->untransformableItems);
  this->regenerateIndex = true;
  startIndexTimer(this,2000);
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::resetIndex()
{
    purgeRemovedItems();
    for (int i = 0; i < indexedItems.size(); ++i) {
        if (QGraphicsItem *item = indexedItems.at(i)) {
            item->d_ptr->index = -1;
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            unindexedItems << item;
        }
    }
    indexedItems.clear();
    freeItemIndexes.clear();
    untransformableItems.clear();
    regenerateIndex = true;
    startIndexTimer();
}